

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O2

ssize_t __thiscall
sc_core::vcd_unsigned_int_trace::write(vcd_unsigned_int_trace *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  undefined4 in_register_00000034;
  char rawdata [1000];
  char compdata [1000];
  
  uVar1 = *this->object;
  uVar2 = (this->super_vcd_trace).bit_width;
  if ((uVar1 & ~this->mask) == 0) {
    uVar5 = 1 << ((char)uVar2 - 1U & 0x1f);
    uVar4 = 0;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      rawdata[uVar4] = (uVar1 & uVar5) == 0 ^ 0x31;
      uVar5 = uVar5 >> 1;
    }
  }
  else {
    uVar4 = 0;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      rawdata[uVar4] = 'x';
    }
  }
  rawdata[uVar3] = '\0';
  vcd_trace::compose_data_line(&this->super_vcd_trace,rawdata,compdata);
  fputs(compdata,(FILE *)CONCAT44(in_register_00000034,__fd));
  uVar1 = *this->object;
  this->old_value = uVar1;
  return (ulong)uVar1;
}

Assistant:

void
vcd_unsigned_int_trace::write(FILE* f)
{
    char rawdata[1000];
    char compdata[1000];
    int bitindex;

    // Check for overflow
    if ((object & mask) != object) {
        for (bitindex = 0; bitindex < bit_width; bitindex++){
            rawdata[bitindex] = 'x';
        }
    }
    else {
        unsigned bit_mask = 1 << (bit_width-1);
        for (bitindex = 0; bitindex < bit_width; bitindex++) {
            rawdata[bitindex] = (object & bit_mask)? '1' : '0';
            bit_mask = bit_mask >> 1;
        }
    }
    rawdata[bitindex] = '\0';
    compose_data_line(rawdata, compdata);
    std::fputs(compdata, f);
    old_value = object;
}